

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ossl_new_session_cb(SSL *ssl,SSL_SESSION *ssl_sessionid)

{
  Curl_cfilter *cf_00;
  Curl_easy *local_48;
  Curl_easy *local_40;
  ssl_peer *local_38;
  ssl_connect_data *connssl;
  Curl_easy *data;
  Curl_cfilter *cf;
  SSL_SESSION *ssl_sessionid_local;
  SSL *ssl_local;
  
  cf_00 = (Curl_cfilter *)SSL_get_ex_data((SSL *)ssl,0);
  if (cf_00 == (Curl_cfilter *)0x0) {
    local_38 = (ssl_peer *)0x0;
  }
  else {
    local_38 = (ssl_peer *)cf_00->ctx;
  }
  if (local_38 == (ssl_peer *)0x0) {
    local_48 = (Curl_easy *)0x0;
  }
  else {
    if (cf_00 == (Curl_cfilter *)0x0) {
      local_40 = (Curl_easy *)0x0;
    }
    else {
      local_40 = *(Curl_easy **)((long)cf_00->ctx + 0x38);
    }
    local_48 = local_40;
  }
  Curl_ossl_add_session(cf_00,local_48,local_38,ssl_sessionid);
  return 0;
}

Assistant:

static int ossl_new_session_cb(SSL *ssl, SSL_SESSION *ssl_sessionid)
{
  struct Curl_cfilter *cf;
  struct Curl_easy *data;
  struct ssl_connect_data *connssl;

  cf = (struct Curl_cfilter*) SSL_get_app_data(ssl);
  connssl = cf? cf->ctx : NULL;
  data = connssl? CF_DATA_CURRENT(cf) : NULL;
  Curl_ossl_add_session(cf, data, &connssl->peer, ssl_sessionid);
  return 0;
}